

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::UnaryExpression::serializeTo(UnaryExpression *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  sVar1 = ast::toString(this->op);
  ASTSerializer::write(serializer,2,"op",sVar1._M_len);
  ASTSerializer::write(serializer,7,"operand",(size_t)this->operand_);
  return;
}

Assistant:

void UnaryExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("operand", operand());
}